

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O0

void __thiscall cmGeneratedFileStream::cmGeneratedFileStream(cmGeneratedFileStream *this)

{
  cmGeneratedFileStream *this_local;
  
  std::ios::ios((ios *)&(this->super_ofstream).field_0x140);
  cmGeneratedFileStreamBase::cmGeneratedFileStreamBase
            ((cmGeneratedFileStreamBase *)
             &(this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  std::ofstream::ofstream(this);
  (this->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&PTR__cmGeneratedFileStream_002d1658;
  *(undefined ***)&(this->super_ofstream).field_0x140 = &PTR__cmGeneratedFileStream_002d1680;
  return;
}

Assistant:

cmGeneratedFileStream::cmGeneratedFileStream():
  cmGeneratedFileStreamBase(), Stream()
{
}